

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O3

void __thiscall covenant::CFGConnect::scc(CFGConnect *this,CFG *g)

{
  pointer pVVar1;
  pointer piVar2;
  pointer piVar3;
  long lVar4;
  ulong uVar5;
  pointer pvVar6;
  pointer pvVar7;
  ulong uVar8;
  bool bVar9;
  
  cleanup(this,(EVP_PKEY_CTX *)g);
  SCC_Init(this,g);
  SCC_Compute(this,(int)((ulong)((long)(this->verts).
                                       super__Vector_base<covenant::CFGConnect::VertInfo,_std::allocator<covenant::CFGConnect::VertInfo>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->verts).
                                      super__Vector_base<covenant::CFGConnect::VertInfo,_std::allocator<covenant::CFGConnect::VertInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333
                   + -1);
  pVVar1 = (this->verts).
           super__Vector_base<covenant::CFGConnect::VertInfo,_std::allocator<covenant::CFGConnect::VertInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->verts).
  super__Vector_base<covenant::CFGConnect::VertInfo,_std::allocator<covenant::CFGConnect::VertInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = pVVar1 + -1;
  piVar2 = pVVar1[-1].edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  pvVar7 = (this->groups).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar6 = pvVar7 + -1;
  (this->groups).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar6;
  piVar2 = pvVar7[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
    pvVar6 = (this->groups).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  pvVar7 = (this->groups).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pvVar6 != pvVar7) {
    uVar5 = 0;
    uVar8 = 1;
    do {
      piVar2 = pvVar7[uVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar3 = pvVar7[uVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (piVar2 != piVar3) {
        uVar5 = (long)piVar3 - (long)piVar2 >> 2;
        lVar4 = 0x3f;
        if (uVar5 != 0) {
          for (; uVar5 >> lVar4 == 0; lVar4 = lVar4 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (piVar2,piVar3,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (piVar2,piVar3);
        pvVar7 = (this->groups).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar6 = (this->groups).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar5 = ((long)pvVar6 - (long)pvVar7 >> 3) * -0x5555555555555555;
      bVar9 = uVar8 <= uVar5;
      lVar4 = uVar5 - uVar8;
      uVar5 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar9 && lVar4 != 0);
  }
  return;
}

Assistant:

void scc(CFG& g){
      cleanup();
      SCC_Init(g);
      SCC_Compute(verts.size()-1);
      
      // Eliminate the fake vertex.
      verts.pop_back();
      groups.pop_back();

      // Sort to make queries more efficient
      for (unsigned int i=0; i < groups.size(); i++){
	sort(groups[i].begin(), groups[i].end());
      }
    }